

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

bool __thiscall
google::anon_unknown_8::LogFileObject::CreateLogfile(LogFileObject *this,string *time_pid_string)

{
  bool bVar1;
  int iVar2;
  FILE *__p;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  char *__to;
  char *local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  char *local_100;
  char *linkdest;
  string local_f0 [32];
  string local_d0 [8];
  string linkpath;
  undefined1 local_90 [8];
  string linkname;
  char *slash;
  int wlock_ret;
  int local_5c;
  FileDescriptor fd;
  int flags;
  char *filename;
  string local_40 [8];
  string string_filename;
  string *time_pid_string_local;
  LogFileObject *this_local;
  
  string_filename.field_2._8_8_ = time_pid_string;
  std::__cxx11::string::string(local_40,(string *)&this->base_filename_);
  if ((fLB::FLAGS_timestamp_in_logfile_name & 1) != 0) {
    std::__cxx11::string::operator+=(local_40,(string *)string_filename.field_2._8_8_);
  }
  std::__cxx11::string::operator+=(local_40,(string *)&this->filename_extension_);
  _fd = (char *)std::__cxx11::string::c_str();
  local_5c = 0x41;
  if ((fLB::FLAGS_timestamp_in_logfile_name & 1) != 0) {
    local_5c = 0xc1;
  }
  iVar2 = open(_fd,local_5c,(ulong)fLI::FLAGS_logfile_mode);
  glog_internal_namespace_::FileDescriptor::FileDescriptor((FileDescriptor *)&wlock_ret,iVar2);
  bVar1 = glog_internal_namespace_::FileDescriptor::operator_cast_to_bool
                    ((FileDescriptor *)&wlock_ret);
  if (bVar1) {
    iVar2 = glog_internal_namespace_::FileDescriptor::get((FileDescriptor *)&wlock_ret);
    fcntl(iVar2,2,1);
    CreateLogfile::w_lock.l_type = 1;
    CreateLogfile::w_lock.l_start = 0;
    CreateLogfile::w_lock.l_whence = 0;
    CreateLogfile::w_lock.l_len = 0;
    iVar2 = glog_internal_namespace_::FileDescriptor::get((FileDescriptor *)&wlock_ret);
    iVar2 = fcntl(iVar2,6,&CreateLogfile::w_lock);
    if (iVar2 == -1) {
      this_local._7_1_ = false;
    }
    else {
      iVar2 = glog_internal_namespace_::FileDescriptor::release((FileDescriptor *)&wlock_ret);
      __p = fdopen(iVar2,"a");
      std::unique_ptr<_IO_FILE,_std::default_delete<_IO_FILE>_>::reset(&this->file_,(pointer)__p);
      bVar1 = std::operator==(&this->file_,(nullptr_t)0x0);
      if (bVar1) {
        if ((fLB::FLAGS_timestamp_in_logfile_name & 1) != 0) {
          unlink(_fd);
        }
        this_local._7_1_ = false;
      }
      else {
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          linkname.field_2._8_8_ = strrchr(_fd,0x2f);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&linkpath.field_2 + 8),&this->symlink_basename_,'.');
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&linkpath.field_2 + 8),
                         *(char **)(LogSeverityNames + (ulong)this->severity_ * 8));
          std::__cxx11::string::~string((string *)(linkpath.field_2._M_local_buf + 8));
          std::__cxx11::string::string(local_d0);
          pcVar5 = _fd;
          if (linkname.field_2._8_8_ != 0) {
            lVar4 = linkname.field_2._8_8_ - (long)_fd;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      (local_f0,pcVar5,lVar4 + 1,(allocator *)((long)&linkdest + 7));
            std::__cxx11::string::operator=(local_d0,local_f0);
            std::__cxx11::string::~string(local_f0);
            std::allocator<char>::~allocator((allocator<char> *)((long)&linkdest + 7));
          }
          std::__cxx11::string::operator+=(local_d0,(string *)local_90);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          unlink(pcVar5);
          if (linkname.field_2._8_8_ == 0) {
            local_180 = _fd;
          }
          else {
            local_180 = (char *)(linkname.field_2._8_8_ + 1);
          }
          local_100 = local_180;
          pcVar5 = (char *)std::__cxx11::string::c_str();
          symlink(local_180,pcVar5);
          uVar3 = std::__cxx11::string::empty();
          if ((uVar3 & 1) == 0) {
            std::operator+(&local_140,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           fLS::FLAGS_log_link_buf_abi_cxx11_,"/");
            std::operator+(&local_120,&local_140,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_90);
            std::__cxx11::string::operator=(local_d0,(string *)&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_140);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            unlink(pcVar5);
            pcVar5 = _fd;
            __to = (char *)std::__cxx11::string::c_str();
            symlink(pcVar5,__to);
          }
          std::__cxx11::string::~string(local_d0);
          std::__cxx11::string::~string((string *)local_90);
        }
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  glog_internal_namespace_::FileDescriptor::~FileDescriptor((FileDescriptor *)&wlock_ret);
  std::__cxx11::string::~string(local_40);
  return this_local._7_1_;
}

Assistant:

bool LogFileObject::CreateLogfile(const string& time_pid_string) {
  string string_filename = base_filename_;
  if (FLAGS_timestamp_in_logfile_name) {
    string_filename += time_pid_string;
  }
  string_filename += filename_extension_;
  const char* filename = string_filename.c_str();
  // only write to files, create if non-existant.
  int flags = O_WRONLY | O_CREAT;
  if (FLAGS_timestamp_in_logfile_name) {
    // demand that the file is unique for our timestamp (fail if it exists).
    flags = flags | O_EXCL;
  }
  FileDescriptor fd{
      open(filename, flags, static_cast<mode_t>(FLAGS_logfile_mode))};
  if (!fd) return false;
#ifdef HAVE_FCNTL
  // Mark the file close-on-exec. We don't really care if this fails
  fcntl(fd.get(), F_SETFD, FD_CLOEXEC);

  // Mark the file as exclusive write access to avoid two clients logging to the
  // same file. This applies particularly when !FLAGS_timestamp_in_logfile_name
  // (otherwise open would fail because the O_EXCL flag on similar filename).
  // locks are released on unlock or close() automatically, only after log is
  // released.
  // This will work after a fork as it is not inherited (not stored in the fd).
  // Lock will not be lost because the file is opened with exclusive lock
  // (write) and we will never read from it inside the process.
  // TODO: windows implementation of this (as flock is not available on
  // mingw).
  static struct flock w_lock;

  w_lock.l_type = F_WRLCK;
  w_lock.l_start = 0;
  w_lock.l_whence = SEEK_SET;
  w_lock.l_len = 0;

  int wlock_ret = fcntl(fd.get(), F_SETLK, &w_lock);
  if (wlock_ret == -1) {
    return false;
  }
#endif

  // fdopen in append mode so if the file exists it will fseek to the end
  file_.reset(fdopen(fd.release(), "a"));  // Make a FILE*.
  if (file_ == nullptr) {                  // Man, we're screwed!
    if (FLAGS_timestamp_in_logfile_name) {
      unlink(filename);  // Erase the half-baked evidence: an unusable log file,
                         // only if we just created it.
    }
    return false;
  }
#ifdef GLOG_OS_WINDOWS
  // https://github.com/golang/go/issues/27638 - make sure we seek to the end to
  // append empirically replicated with wine over mingw build
  if (!FLAGS_timestamp_in_logfile_name) {
    if (fseek(file_.get(), 0, SEEK_END) != 0) {
      return false;
    }
  }
#endif
  // We try to create a symlink called <program_name>.<severity>,
  // which is easier to use.  (Every time we create a new logfile,
  // we destroy the old symlink and create a new one, so it always
  // points to the latest logfile.)  If it fails, we're sad but it's
  // no error.
  if (!symlink_basename_.empty()) {
    // take directory from filename
    const char* slash = strrchr(filename, PATH_SEPARATOR);
    const string linkname =
        symlink_basename_ + '.' + LogSeverityNames[severity_];
    string linkpath;
    if (slash)
      linkpath = string(
          filename, static_cast<size_t>(slash - filename + 1));  // get dirname
    linkpath += linkname;
    unlink(linkpath.c_str());  // delete old one if it exists

#if defined(GLOG_OS_WINDOWS)
    // TODO(hamaji): Create lnk file on Windows?
#elif defined(HAVE_UNISTD_H)
    // We must have unistd.h.
    // Make the symlink be relative (in the same dir) so that if the
    // entire log directory gets relocated the link is still valid.
    const char* linkdest = slash ? (slash + 1) : filename;
    if (symlink(linkdest, linkpath.c_str()) != 0) {
      // silently ignore failures
    }

    // Make an additional link to the log file in a place specified by
    // FLAGS_log_link, if indicated
    if (!FLAGS_log_link.empty()) {
      linkpath = FLAGS_log_link + "/" + linkname;
      unlink(linkpath.c_str());  // delete old one if it exists
      if (symlink(filename, linkpath.c_str()) != 0) {
        // silently ignore failures
      }
    }
#endif
  }

  return true;  // Everything worked
}